

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O3

void __thiscall
de::AppendList<vk::AllocationCallbackRecord>::append
          (AppendList<vk::AllocationCallbackRecord> *this,AllocationCallbackRecord *value)

{
  size_t *psVar1;
  void **ppvVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  Type TVar7;
  undefined4 uVar8;
  ulong uVar9;
  Block *pBVar10;
  AllocationCallbackRecord *pAVar11;
  ulong uVar12;
  Block *pBVar13;
  ulong uVar14;
  
  pBVar13 = this->m_last;
  LOCK();
  psVar1 = &this->m_numElements;
  uVar12 = *psVar1;
  *psVar1 = *psVar1 + 1;
  UNLOCK();
  uVar14 = this->m_blockSize;
  uVar9 = uVar12 / uVar14;
  uVar12 = uVar12 % uVar14;
  if (pBVar13->blockNdx != uVar9) {
    do {
      if (pBVar13->next == (Block *)0x0) {
        deYield();
      }
      else {
        pBVar13 = pBVar13->next;
      }
    } while (pBVar13->blockNdx != uVar9);
    uVar14 = this->m_blockSize;
  }
  if (uVar12 + 1 == uVar14) {
    pBVar10 = (Block *)operator_new(0x18);
    pBVar10->blockNdx = uVar9 + 1;
    pAVar11 = (AllocationCallbackRecord *)deAlignedMalloc(uVar14 * 0x30,8);
    pBVar10->elements = pAVar11;
    pBVar10->next = (Block *)0x0;
    this->m_last = pBVar10;
    pBVar13->next = pBVar10;
  }
  pAVar11 = pBVar13->elements;
  TVar7 = value->type;
  uVar8 = *(undefined4 *)&value->field_0x4;
  sVar3 = (value->data).allocation.size;
  sVar4 = (value->data).allocation.alignment;
  sVar5 = (value->data).reallocation.alignment;
  pvVar6 = (value->data).reallocation.returnedPtr;
  ppvVar2 = &pAVar11[uVar12].data.allocation.returnedPtr;
  *ppvVar2 = (value->data).allocation.returnedPtr;
  ppvVar2[1] = pvVar6;
  psVar1 = &pAVar11[uVar12].data.allocation.alignment;
  *psVar1 = sVar4;
  psVar1[1] = sVar5;
  pAVar11 = pAVar11 + uVar12;
  pAVar11->type = TVar7;
  *(undefined4 *)&pAVar11->field_0x4 = uVar8;
  (pAVar11->data).allocation.size = sVar3;
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}